

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::setTimeout(CommsInterface *this,milliseconds timeOut)

{
  bool bVar1;
  
  bVar1 = propertyLock(this);
  if (bVar1) {
    (this->connectionTimeout).__r = timeOut.__r;
    propertyUnLock(this);
    return;
  }
  return;
}

Assistant:

void CommsInterface::setTimeout(std::chrono::milliseconds timeOut)
{
    if (propertyLock()) {
        connectionTimeout = timeOut;
        propertyUnLock();
    }
}